

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O3

char * current_line(void)

{
  char cVar1;
  char *pcVar2;
  
  pcVar2 = current_line::buf;
  sprintf(current_line::buf,"at line %d in file %s:\\n%s",(ulong)(linenum - 1),finname,
          (ulong)(whichbuf == 0) * 0x2000 + 0x1382ce);
  do {
    cVar1 = *pcVar2;
    if (cVar1 == '\n') {
      cVar1 = '\0';
LAB_00104db8:
      *pcVar2 = cVar1;
    }
    else {
      if (cVar1 == '\"') {
        cVar1 = '\'';
        goto LAB_00104db8;
      }
      if (cVar1 == '\0') {
        return current_line::buf;
      }
    }
    pcVar2 = pcVar2 + 1;
  } while( true );
}

Assistant:

char* current_line() { /* assumes we actually want the previous line */
	static char buf[NRN_BUFSIZE];
	char* p;
	sprintf(buf,"at line %d in file %s:\\n%s", linenum-1, finname,
		inlinebuf[whichbuf?0:1]+30);
	for (p = buf; *p; ++p) {
		if (*p == '\n') {
			*p = '\0';
		}
		if (*p == '"') {
			*p = '\047';
		}
	}
	return buf;
}